

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzer.cpp
# Opt level: O3

RGBResult * __thiscall
AsyncRgbLedAnalyzer::ReadRGBTriple(RGBResult *__return_storage_ptr__,AsyncRgbLedAnalyzer *this)

{
  byte bVar1;
  ColorLayout layout;
  RGBValue RVar2;
  undefined1 uVar3;
  long lVar4;
  U64 UVar5;
  U64 UVar6;
  uint uVar7;
  RGBResult *pRVar8;
  U16 channels [3];
  DataBuilder builder;
  U64 value;
  ReadResult bitResult;
  U64 local_70;
  U16 local_68 [4];
  RGBResult *local_60;
  DataBuilder local_58 [8];
  undefined8 local_50;
  ReadResult local_48;
  
  bVar1 = AsyncRgbLedAnalyzerSettings::BitSize
                    ((this->mSettings)._M_t.
                     super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                     .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl);
  local_68[2] = 0;
  local_68[0] = 0;
  local_68[1] = 0;
  __return_storage_ptr__->mValid = false;
  (__return_storage_ptr__->mRGB).red = 0;
  (__return_storage_ptr__->mRGB).green = 0;
  (__return_storage_ptr__->mRGB).blue = 0;
  (__return_storage_ptr__->mRGB).padding = 0;
  __return_storage_ptr__->mValueBeginSample = 0;
  __return_storage_ptr__->mValueEndSample = 0;
  local_60 = __return_storage_ptr__;
  DataBuilder::DataBuilder(local_58);
  lVar4 = 0;
  UVar5 = 0;
  local_70 = 0;
  uVar3 = 0;
  do {
    local_50 = 0;
    DataBuilder::Reset((ulonglong *)local_58,(ShiftOrder)&local_50,0);
    uVar7 = 0;
    UVar6 = UVar5;
    if (bVar1 == 0) {
LAB_00107166:
      UVar5 = UVar6;
      if (uVar7 != bVar1) {
        local_60->mValueEndSample = UVar5;
        local_60->mValueBeginSample = local_70;
        local_60->mIsReset = (bool)uVar3;
        pRVar8 = local_60;
        if (lVar4 != 3) goto LAB_001071d4;
        goto LAB_001071b7;
      }
    }
    else {
      do {
        ReadBit(&local_48,this);
        UVar5 = local_48.mEndSample;
        if (local_48.mValid == false) goto LAB_00107166;
        if (uVar7 == 0 && (int)lVar4 == 0) {
          local_70 = local_48.mBeginSample;
        }
        DataBuilder::AddBit((BitState)local_58);
        uVar7 = uVar7 + 1;
        UVar6 = UVar5;
        uVar3 = local_48.mIsReset;
      } while (bVar1 != uVar7);
    }
    local_68[lVar4] = (U16)local_50;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_60->mValueEndSample = UVar5;
  local_60->mValueBeginSample = local_70;
  local_60->mIsReset = (bool)uVar3;
LAB_001071b7:
  pRVar8 = local_60;
  layout = AsyncRgbLedAnalyzerSettings::GetColorLayout
                     ((this->mSettings)._M_t.
                      super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                      .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl);
  RVar2 = RGBValue::CreateFromControllerOrder(layout,local_68);
  pRVar8->mRGB = RVar2;
  pRVar8->mValid = true;
LAB_001071d4:
  DataBuilder::~DataBuilder(local_58);
  return pRVar8;
}

Assistant:

auto AsyncRgbLedAnalyzer::ReadRGBTriple() -> RGBResult
{
    const U8 bitSize = mSettings->BitSize();
    U16 channels[ 3 ] = { 0, 0, 0 };
    RGBResult result;

    DataBuilder builder;
    int channel = 0;

    for( ; channel < 3; )
    {
        U64 value = 0;
        builder.Reset( &value, AnalyzerEnums::MsbFirst, bitSize );
        int i = 0;

        for( ; i < bitSize; ++i )
        {
            auto bitResult = ReadBit();

            if( !bitResult.mValid )
            {
                break;
            }

            // for the first bit of channel 0, record the beginning time
            // for accurate frame positions in the results
            if( ( i == 0 ) && ( channel == 0 ) )
            {
                result.mValueBeginSample = bitResult.mBeginSample;
            }

            result.mValueEndSample = bitResult.mEndSample;
            builder.AddBit( bitResult.mBitValue );
            result.mIsReset = bitResult.mIsReset;
        }

        if( i == bitSize )
        {
            // we saw a complete channel, save it
            channels[ channel++ ] = value;
        }
        else
        {
            // partial data due to reset or invalid timing, discard
            break;
        }
    }

    if( channel == 3 )
    {
        // we saw three complete channels, we can use this
        result.mRGB = RGBValue::CreateFromControllerOrder( mSettings->GetColorLayout(), channels );
        result.mValid = true;
    } // in all other cases, mValid stays false - no RGB data was written

    return result;
}